

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int main(int argc,char **argv)

{
  FILE *__stream;
  uint uVar1;
  long lVar2;
  code *pcVar3;
  undefined8 uVar4;
  bool bVar5;
  code *local_40;
  int local_34;
  int result;
  int n;
  int i;
  _func_int *count;
  void *counter_module;
  char **argv_local;
  int argc_local;
  
  lVar2 = dlopen("./counter.so",0x101);
  if ((lVar2 == 0) || (pcVar3 = (code *)dlsym(lVar2,"count"), pcVar3 == (code *)0x0)) {
    __stream = _stderr;
    uVar4 = dlerror();
    fprintf(__stream,"Error occured:\n    %s\n",uVar4);
    local_34 = 0xfb;
  }
  else {
    local_34 = 0;
    for (result = 0; result < 10; result = result + 1) {
      local_40 = pcVar3;
      if (result % 2 == 0) {
        local_40 = my_count;
      }
      uVar1 = (*local_40)();
      bVar5 = local_34 != 0;
      local_34 = 0;
      if (bVar5 || uVar1 != result) {
        local_34 = 0xfa;
      }
      printf("%d\n",(ulong)uVar1);
    }
  }
  if (lVar2 != 0) {
    dlclose(lVar2);
  }
  return local_34;
}

Assistant:

int main(int argc, char **argv) {
    void *counter_module;
    int (*count)(void);
    int i, n;
    int result;

    counter_module = dlopen("./counter.so", RTLD_LAZY | RTLD_GLOBAL);
    if(!counter_module) goto error;

    count = dlsym(counter_module, "count");
    if(!count) goto error;

    result = 0;
    for(i=0; i<10; ++i) {
        n = ((i%2) ? count : my_count)();
        result = (result || n != i) ? 250 : 0;
        printf("%d\n", n);
    }

    goto done;
    error:
        fprintf(stderr, "Error occured:\n    %s\n", dlerror());
        result = 251;

    done:
        if(counter_module) dlclose(counter_module);
        return result;
}